

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_vector.c
# Opt level: O0

void vector_insert(vector v,size_t position,void *element)

{
  int iVar1;
  void *pvVar2;
  void *__src;
  vector in_RDX;
  ulong in_RSI;
  vector in_RDI;
  size_t in_stack_ffffffffffffffe0;
  
  if (in_RDI != (vector)0x0) {
    if ((in_RDI->size == in_RDI->capacity) &&
       (iVar1 = vector_reserve(in_RDX,in_stack_ffffffffffffffe0), iVar1 != 0)) {
      log_write_impl_va("metacall",0x1a5,"vector_insert",
                        "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/adt/source/adt_vector.c"
                        ,3,"Vector reserve error");
    }
    if (in_RSI < in_RDI->size) {
      pvVar2 = vector_data_offset_bytes(in_RDI,(in_RSI + 1) * in_RDI->type_size);
      __src = vector_data_offset_bytes(in_RDI,in_RSI * in_RDI->type_size);
      memmove(pvVar2,__src,(in_RDI->size - in_RSI) * in_RDI->type_size);
      pvVar2 = vector_data_offset_bytes(in_RDI,in_RSI * in_RDI->type_size);
      memcpy(pvVar2,in_RDX,in_RDI->type_size);
    }
    else {
      pvVar2 = vector_data_offset_bytes(in_RDI,in_RDI->size * in_RDI->type_size);
      memcpy(pvVar2,in_RDX,in_RDI->type_size);
    }
    in_RDI->size = in_RDI->size + 1;
  }
  return;
}

Assistant:

void vector_insert(vector v, size_t position, void *element)
{
	if (v != NULL)
	{
		if (v->size == v->capacity)
		{
			if (vector_reserve(v, v->capacity * VECTOR_CAPACITY_INCREMENT) != 0)
			{
				log_write("metacall", LOG_LEVEL_ERROR, "Vector reserve error");
			}
		}

		if (position < v->size)
		{
			memmove(vector_data_offset_bytes(v, (position + 1) * v->type_size),
				vector_data_offset_bytes(v, position * v->type_size),
				(v->size - position) * v->type_size);

			memcpy(vector_data_offset_bytes(v, position * v->type_size), element, v->type_size);
		}
		else
		{
			memcpy(vector_data_offset_bytes(v, v->size * v->type_size), element, v->type_size);
		}

		++v->size;
	}
}